

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_handle_custom_dialogues.hpp
# Opt level: O2

void __thiscall
PatchHandleCustomDialogues::inject_data(PatchHandleCustomDialogues *this,ROM *rom,World *world)

{
  uint32_t uVar1;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
  uVar1 = md::ROM::inject_bytes
                    (rom,&(this->_custom_text_lut).
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_30);
  this->_custom_text_lut_addr = uVar1;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
  uVar1 = md::ROM::inject_bytes
                    (rom,&(this->_custom_text_script_words).
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_30);
  this->_custom_text_script_words_addr = uVar1;
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void inject_data(md::ROM& rom, World& world) override
    {
        _custom_text_lut_addr = rom.inject_bytes(_custom_text_lut);
        _custom_text_script_words_addr = rom.inject_bytes(_custom_text_script_words);
    }